

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tally.cpp
# Opt level: O3

TallyState * __thiscall ccs::TallyState::activate(TallyState *this,Node *leg,Specificity *spec)

{
  AndTally *pAVar1;
  Specificity SVar2;
  Specificity SVar3;
  TallyState *pTVar4;
  
  pTVar4 = (TallyState *)operator_new(0x20);
  pAVar1 = this->tally;
  pTVar4->tally = pAVar1;
  pTVar4->firstMatched = this->firstMatched;
  SVar2 = this->firstMatch;
  pTVar4->firstMatch = SVar2;
  pTVar4->secondMatched = this->secondMatched;
  SVar3 = this->secondMatch;
  pTVar4->secondMatch = SVar3;
  if ((pAVar1->super_Tally).firstLeg_ == leg) {
    pTVar4->firstMatched = true;
    if ((SVar2.values < spec->values) ||
       ((spec->values == SVar2.values && (SVar2.names < spec->names)))) {
      pTVar4->firstMatch = *spec;
    }
  }
  if ((pAVar1->super_Tally).secondLeg_ == leg) {
    pTVar4->secondMatched = true;
    if ((SVar3.values < spec->values) ||
       ((spec->values == SVar3.values && (SVar3.names < spec->names)))) {
      pTVar4->secondMatch = *spec;
    }
  }
  return pTVar4;
}

Assistant:

TallyState *TallyState::activate(const Node &leg,
    const Specificity &spec) const {
  // NB reference equality in the below...
  TallyState *next = clone();
  if (&tally.firstLeg_ == &leg) {
    next->firstMatched = true;
    if (next->firstMatch < spec) next->firstMatch = spec;
  }
  if (&tally.secondLeg_ == &leg) {
    next->secondMatched = true;
    if (next->secondMatch < spec) next->secondMatch = spec;
  }
  return next;
}